

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsFederate
helicsCreateCombinationFederate(char *fedName,HelicsFederateInfo fedInfo,HelicsError *err)

{
  CombinationFederate *pCVar1;
  size_t sVar2;
  HelicsFederate pvVar3;
  element_type *peVar4;
  CombinationFederate *pCVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  FederateInfo *__args_1;
  bool bVar6;
  undefined1 local_209;
  undefined1 local_208 [32];
  CombinationFederate *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  shared_ptr<helics::Federate> local_1d8;
  undefined1 local_1c8 [424];
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
      pCVar1 = (CombinationFederate *)(local_208 + 0x10);
      local_208._0_8_ = pCVar1;
      if (fedName == (char *)0x0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                   gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                   gHelicsEmptyStr_abi_cxx11_._M_string_length);
      }
      else {
        sVar2 = strlen(fedName);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,fedName,fedName + sVar2)
        ;
      }
      helics::FederateInfo::FederateInfo((FederateInfo *)local_1c8);
      local_1e8 = (CombinationFederate *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::CombinationFederate,std::allocator<helics::CombinationFederate>,std::__cxx11::string_const,helics::FederateInfo>
                (&_Stack_1e0,&local_1e8,(allocator<helics::CombinationFederate> *)&local_209,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 (FederateInfo *)local_1c8);
      local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_1e0._M_pi;
      if (local_1e8 == (CombinationFederate *)0x0) {
        peVar4 = (element_type *)0x0;
      }
      else {
        peVar4 = (element_type *)
                 ((long)&(local_1e8->super_ValueFederate)._vptr_ValueFederate +
                 (long)(local_1e8->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e8 = (CombinationFederate *)0x0;
      helics::FederateInfo::~FederateInfo((FederateInfo *)local_1c8);
      pCVar5 = (CombinationFederate *)local_208._0_8_;
      if ((CombinationFederate *)local_208._0_8_ != pCVar1) {
LAB_001a1c0c:
        operator_delete(pCVar5,local_208._16_8_ + 1);
      }
    }
    else {
      if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
        bVar6 = *(int *)((long)fedInfo + 0x48) == 0x6bfbbce1;
        __args_1 = (FederateInfo *)0x0;
        if (bVar6) {
          __args_1 = (FederateInfo *)fedInfo;
        }
        if (!bVar6 && err != (HelicsError *)0x0) {
          err->error_code = -3;
          err->message = "helics Federate info object was not valid";
          goto LAB_001a1a89;
        }
      }
      else {
LAB_001a1a89:
        __args_1 = (FederateInfo *)0x0;
      }
      if (__args_1 == (FederateInfo *)0x0) goto LAB_001a1c97;
      pCVar1 = (CombinationFederate *)(local_1c8 + 0x10);
      local_1c8._0_8_ = pCVar1;
      if (fedName == (char *)0x0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                   gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                   gHelicsEmptyStr_abi_cxx11_._M_string_length);
      }
      else {
        sVar2 = strlen(fedName);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,fedName,fedName + sVar2)
        ;
      }
      local_208._0_8_ = (CombinationFederate *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::CombinationFederate,std::allocator<helics::CombinationFederate>,std::__cxx11::string_const,helics::FederateInfo&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8),
                 (CombinationFederate **)local_208,
                 (allocator<helics::CombinationFederate> *)&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 __args_1);
      local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
      if ((CombinationFederate *)local_208._0_8_ == (CombinationFederate *)0x0) {
        peVar4 = (element_type *)0x0;
      }
      else {
        peVar4 = (element_type *)(local_208._0_8_ + *(long *)(*(long *)local_208._0_8_ + -0x18));
      }
      local_208._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_208._0_8_ = (CombinationFederate *)0x0;
      local_208._16_8_ = local_1c8._16_8_;
      pCVar5 = (CombinationFederate *)local_1c8._0_8_;
      if ((CombinationFederate *)local_1c8._0_8_ != pCVar1) goto LAB_001a1c0c;
    }
    local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    pvVar3 = generateNewHelicsFederateObject(&local_1d8,COMBINATION);
    if (local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
LAB_001a1c97:
    pvVar3 = (HelicsFederate)0x0;
  }
  return pvVar3;
}

Assistant:

HelicsFederate helicsCreateCombinationFederate(const char* fedName, HelicsFederateInfo fedInfo, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        if (fedInfo == nullptr) {
            fed = std::make_shared<helics::CombinationFederate>(AS_STRING(fedName), helics::FederateInfo());
        } else {
            auto* info = getFedInfo(fedInfo, err);
            if (info == nullptr) {
                return nullptr;
            }
            fed = std::make_shared<helics::CombinationFederate>(AS_STRING(fedName), *info);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::COMBINATION);
}